

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::glx::GlxRenderContext::~GlxRenderContext(GlxRenderContext *this)

{
  ~GlxRenderContext(this);
  operator_delete(this,0x1af0);
  return;
}

Assistant:

GlxRenderContext::~GlxRenderContext (void)
{
	clearCurrent();
	if (m_GLXContext != DE_NULL)
		glXDestroyContext(m_glxDisplay.getXDisplay(), m_GLXContext);
}